

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O3

void Omega_h::gmsh::anon_unknown_0::seek_line(istream *stream,string *want)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  string line;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  lVar4 = *(long *)(*(long *)stream + -0x18);
  if (((byte)stream[lVar4 + 0x20] & 5) != 0) {
    fail("assertion %s failed at %s +%d\n","stream",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x62);
  }
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  while( true ) {
    cVar1 = std::ios::widen((char)lVar4 + (char)stream);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_40,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    if (local_38 == want->_M_string_length) {
      if (local_38 == 0) break;
      iVar2 = bcmp(local_40,(want->_M_dataplus)._M_p,local_38);
      if (iVar2 == 0) break;
    }
    lVar4 = *(long *)(*(long *)stream + -0x18);
  }
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
    return;
  }
  fail("assertion %s failed at %s +%d\n","stream",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0x69);
}

Assistant:

void seek_line(std::istream& stream, std::string const& want) {
  OMEGA_H_CHECK(stream);
  std::string line;
  while (std::getline(stream, line)) {
    if (line == want) {
      break;
    }
  }
  OMEGA_H_CHECK(stream);
}